

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

OpenMDBitSet * __thiscall
OpenMD::OpenMDBitSet::parallelReduce(OpenMDBitSet *__return_storage_ptr__,OpenMDBitSet *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  _Bvector_impl *p_Var3;
  _Bit_iterator __first;
  _Bit_iterator __last;
  
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  p_Var3 = &(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar1 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar2;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::_Bit_iterator,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>>
            (__first,__last,
             (back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_>)__return_storage_ptr__
            );
  return __return_storage_ptr__;
}

Assistant:

OpenMDBitSet OpenMDBitSet::parallelReduce() {
    OpenMDBitSet result;

#ifdef IS_MPI

    // This is necessary because std::vector<bool> isn't really a
    // std::vector, so we can't pass the address of the first element
    // to the MPI call that follows.  We first have to convert to a
    // std::vector<int> to do the logical_or Allreduce call, then back
    // convert it into the vector<bool>.

    std::vector<int> bsInt(bitset_.begin(), bitset_.end());

    MPI_Allreduce(MPI_IN_PLACE, &bsInt[0], bsInt.size(), MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);

    std::transform(bsInt.begin(), bsInt.end(),
                   std::back_inserter(result.bitset_),
                   [](int val) { return val != 0; });
#else
    // Not in MPI?  Just return a copy of the current bitset:
    std::copy(bitset_.begin(), bitset_.end(),
              std::back_inserter(result.bitset_));
#endif

    return result;
  }